

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdhelpers.c
# Opt level: O1

char * gd_strtok_r(char *s,char *sep,char **state)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  char separators [256];
  char acStack_118 [256];
  
  memset(acStack_118,0,0x100);
  bVar2 = *sep;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(sep + 1);
    do {
      acStack_118[bVar2] = '\x01';
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
  }
  if (s == (char *)0x0) {
    s = *state;
  }
  if ((ulong)(byte)*s == 0) {
LAB_00122767:
    pbVar3 = (byte *)0x0;
  }
  else {
    pbVar3 = (byte *)s;
    if (acStack_118[(byte)*s] != '\0') {
      do {
        pbVar1 = (byte *)s + 1;
        s = (char *)((byte *)s + 1);
      } while (acStack_118[*pbVar1] != '\0');
      pbVar3 = (byte *)s;
      if (*pbVar1 == 0) goto LAB_00122767;
    }
    do {
      if (*s == 0) goto LAB_00122769;
      pbVar1 = (byte *)s + 1;
      s = (char *)((byte *)s + 1);
    } while (acStack_118[*pbVar1] == '\0');
    *s = 0;
    do {
      pbVar1 = (byte *)s + 1;
      s = (char *)((byte *)s + 1);
    } while (acStack_118[*pbVar1] != '\0');
  }
LAB_00122769:
  *state = s;
  return (char *)pbVar3;
}

Assistant:

char *
gd_strtok_r (char *s, char *sep, char **state)
{
	char separators[256];
	char *result = 0;
	memset (separators, 0, sizeof (separators));
	while (*sep) {
		separators[*((unsigned char *) sep)] = 1;
		sep++;
	}
	if (!s) {
		/* Pick up where we left off */
		s = *state;
	}
	/* 1. EOS */
	if (!(*s)) {
		*state = s;
		return 0;
	}
	/* 2. Leading separators, if any */
	if (SEP_TEST) {
		do {
			s++;
		} while (SEP_TEST);
		/* 2a. EOS after separators only */
		if (!(*s)) {
			*state = s;
			return 0;
		}
	}
	/* 3. A token */
	result = s;
	do {
		/* 3a. Token at end of string */
		if (!(*s)) {
			*state = s;
			return result;
		}
		s++;
	} while (!SEP_TEST);
	/* 4. Terminate token and skip trailing separators */
	*s = '\0';
	do {
		s++;
	} while (SEP_TEST);
	/* 5. Return token */
	*state = s;
	return result;
}